

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdg-datastore.cc
# Opt level: O3

uint32_t detect_read_size(string *read_filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint *__s;
  long lVar6;
  uint *puVar7;
  value_type_conflict3 *__val;
  uint32_t i;
  ulong uVar8;
  FastqRecord rec;
  FastqReader<FastqRecord> fastqReader;
  FastqRecord local_190;
  FastqReader<FastqRecord> local_108;
  
  __s = (uint *)operator_new(400);
  memset(__s,0,400);
  local_190.name._M_dataplus._M_p = (pointer)&local_190.name.field_2;
  local_190.name._M_string_length = 0;
  local_190.name.field_2._M_local_buf[0] = '\0';
  local_190.comment._M_dataplus._M_p = (pointer)&local_190.comment.field_2;
  local_190.comment._M_string_length = 0;
  local_190.comment.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_190.seq.field_2;
  local_190.seq._M_string_length = 0;
  local_190.seq.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_190.qual.field_2;
  local_190.qual._M_string_length = 0;
  local_190.qual.field_2._M_local_buf[0] = '\0';
  local_190.seq._M_dataplus._M_p = (pointer)paVar1;
  local_190.qual._M_dataplus._M_p = (pointer)paVar2;
  FastqReader<FastqRecord>::FastqReader(&local_108,(FastxReaderParams)0x0,read_filename);
  uVar8 = 0;
  while( true ) {
    bVar4 = FastqReader<FastqRecord>::next_record(&local_108,&local_190);
    if (!bVar4 || 99 < uVar8) break;
    __s[uVar8] = (uint)local_190.seq._M_string_length;
    uVar8 = uVar8 + 1;
  }
  uVar8 = 100;
  do {
    bVar4 = FastqReader<FastqRecord>::next_record(&local_108,&local_190);
    if (!bVar4) break;
    uVar5 = rand();
    if ((uint)((ulong)uVar5 % uVar8) < 100) {
      __s[(ulong)uVar5 % uVar8] = (uint)local_190.seq._M_string_length;
    }
    uVar5 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar5;
  } while (uVar5 != 10000);
  uVar5 = *__s;
  lVar6 = 4;
  puVar7 = __s;
  do {
    uVar3 = *(uint *)((long)__s + lVar6);
    bVar4 = uVar5 < uVar3;
    if (uVar5 <= uVar3) {
      uVar5 = uVar3;
    }
    if (bVar4) {
      puVar7 = (uint *)((long)__s + lVar6);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 400);
  uVar5 = *puVar7;
  FastqReader<FastqRecord>::~FastqReader(&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.qual._M_dataplus._M_p != paVar2) {
    operator_delete(local_190.qual._M_dataplus._M_p,
                    CONCAT71(local_190.qual.field_2._M_allocated_capacity._1_7_,
                             local_190.qual.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.seq._M_dataplus._M_p != paVar1) {
    operator_delete(local_190.seq._M_dataplus._M_p,
                    CONCAT71(local_190.seq.field_2._M_allocated_capacity._1_7_,
                             local_190.seq.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.comment._M_dataplus._M_p != &local_190.comment.field_2) {
    operator_delete(local_190.comment._M_dataplus._M_p,
                    CONCAT71(local_190.comment.field_2._M_allocated_capacity._1_7_,
                             local_190.comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190.name._M_dataplus._M_p != &local_190.name.field_2) {
    operator_delete(local_190.name._M_dataplus._M_p,
                    CONCAT71(local_190.name.field_2._M_allocated_capacity._1_7_,
                             local_190.name.field_2._M_local_buf[0]) + 1);
  }
  operator_delete(__s,400);
  return uVar5;
}

Assistant:

uint32_t detect_read_size(const std::string &read_filename) {
    std::vector<uint32_t> read_sizes(100);

    FastqRecord rec;
    FastqReader<FastqRecord> fastqReader({}, read_filename);
    uint32_t i = 0;
    while(fastqReader.next_record(rec) and i < read_sizes.size()) {
        read_sizes[i++] = rec.seq.size();
    }
    for (uint32_t i = 100; i < 10000 and fastqReader.next_record(rec); i++) {
        uint32_t j = std::rand()%i;
        if (j < 100) {
            read_sizes[j] = rec.seq.size();
        }
    }
    return (*std::max_element(read_sizes.begin(), read_sizes.end()));
}